

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_language_server.hpp
# Opt level: O0

void __thiscall
cmakels::cmake_language_server::cmake_language_server
          (cmake_language_server *this,string *build_directory)

{
  string *build_directory_local;
  cmake_language_server *this_local;
  
  lscpp::lsp_server::lsp_server(&this->super_lsp_server);
  lscpp::TextDocumentService::TextDocumentService(&this->super_TextDocumentService);
  (this->super_lsp_server)._vptr_lsp_server = (_func_int **)&PTR_initialize_00af2de0;
  (this->super_TextDocumentService)._vptr_TextDocumentService = (_func_int **)&DAT_00af2e48;
  std::__cxx11::string::string((string *)&this->root_path_);
  std::__cxx11::string::string((string *)&this->build_directory_,(string *)build_directory);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>_>
  ::map(&this->open_files_);
  std::optional<cmakels::cmake_query::cmake_query>::optional(&this->query_);
  return;
}

Assistant:

cmake_language_server(std::string build_directory)
      : build_directory_{build_directory} {}